

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t * Dar_ManRewriteDefault(Aig_Man_t *pAig)

{
  Aig_Man_t *pAVar1;
  Dar_RwrPar_t *pPars;
  Dar_RwrPar_t Pars;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig_local;
  
  Dar_ManDefaultRwrParams((Dar_RwrPar_t *)((long)&pPars + 4));
  pAVar1 = Aig_ManDupDfs(pAig);
  Dar_ManRewrite(pAVar1,(Dar_RwrPar_t *)((long)&pPars + 4));
  Pars._28_8_ = pAVar1;
  pAVar1 = Aig_ManDupDfs(pAVar1);
  Aig_ManStop((Aig_Man_t *)Pars._28_8_);
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one iteration of AIG rewriting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Dar_ManRewriteDefault( Aig_Man_t * pAig )
{
    Aig_Man_t * pTemp;
    Dar_RwrPar_t Pars, * pPars = &Pars;
    Dar_ManDefaultRwrParams( pPars );
    pAig = Aig_ManDupDfs( pAig ); 
    Dar_ManRewrite( pAig, pPars );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    return pAig;
}